

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qplatformdialoghelper.cpp
# Opt level: O3

void QPlatformColorDialogHelper::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  code *pcVar1;
  long lVar2;
  int iVar3;
  long in_FS_OFFSET;
  void *local_18;
  void *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == IndexOfMethod) {
    pcVar1 = *_a[1];
    lVar2 = *(long *)((long)_a[1] + 8);
    if (pcVar1 == currentColorChanged && lVar2 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar1 == colorSelected && lVar2 == 0) {
      *(undefined4 *)*_a = 1;
    }
  }
  else if (_c == InvokeMetaMethod) {
    if (_id == 1) {
      local_10 = _a[1];
      iVar3 = 1;
    }
    else {
      if (_id != 0) goto LAB_002f3ee6;
      local_10 = _a[1];
      iVar3 = 0;
    }
    local_18 = (void *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar3,&local_18);
  }
LAB_002f3ee6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPlatformColorDialogHelper::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QPlatformColorDialogHelper *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->currentColorChanged((*reinterpret_cast< std::add_pointer_t<QColor>>(_a[1]))); break;
        case 1: _t->colorSelected((*reinterpret_cast< std::add_pointer_t<QColor>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QPlatformColorDialogHelper::*)(const QColor & )>(_a, &QPlatformColorDialogHelper::currentColorChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QPlatformColorDialogHelper::*)(const QColor & )>(_a, &QPlatformColorDialogHelper::colorSelected, 1))
            return;
    }
}